

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::AssertionPortSymbol::buildPorts
               (Scope *scope,AssertionItemPortListSyntax *syntax,
               SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *results)

{
  SymbolKind SVar1;
  SyntaxKind SVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  string_view arg;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  bool bVar3;
  __optional_eq_t<slang::ast::ArgumentDirection,_slang::ast::ArgumentDirection> _Var4;
  Compilation *pCVar5;
  Symbol *pSVar6;
  Type *newType;
  SourceLocation node;
  AssertionPortSymbol *diag;
  DataTypeSyntax *pDVar7;
  PropertyExprSyntax *pPVar8;
  DeclaredType *in_RDI;
  const_iterator cVar9;
  SyntaxKind itemKind;
  AssertionPortSymbol *port;
  AssertionItemPortSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *__range2;
  optional<slang::ast::ArgumentDirection> lastDir;
  DataTypeSyntax *lastType;
  Type *untyped;
  SymbolKind parentKind;
  Compilation *comp;
  SyntaxNode *in_stack_000004a8;
  Scope *in_stack_000004b0;
  DeclaredType *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  bitmask<slang::ast::DeclaredTypeFlags> in_stack_fffffffffffffe54;
  DeclaredType *in_stack_fffffffffffffe58;
  Diagnostic *in_stack_fffffffffffffe60;
  DeclaredType *in_stack_fffffffffffffe68;
  DeclaredType *in_stack_fffffffffffffe70;
  DeclaredType *in_stack_fffffffffffffe78;
  DeclaredType *in_stack_fffffffffffffe80;
  DeclaredType *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  ArgumentDirection in_stack_fffffffffffffe94;
  undefined4 uVar10;
  SyntaxKind in_stack_fffffffffffffe9c;
  undefined4 uVar11;
  Compilation *in_stack_fffffffffffffea0;
  bitmask<slang::ast::DeclaredTypeFlags> local_b0;
  ArgumentDirection local_ac;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_a8;
  SourceLocation local_90;
  string_view local_88;
  AssertionPortSymbol *this;
  SourceLocation SVar12;
  DiagCode code;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_40;
  DataTypeSyntax *local_38;
  
  pCVar5 = Scope::getCompilation((Scope *)in_RDI);
  pSVar6 = Scope::asSymbol((Scope *)in_RDI);
  SVar1 = pSVar6->kind;
  newType = Compilation::getType(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  local_38 = (DataTypeSyntax *)0x0;
  std::optional<slang::ast::ArgumentDirection>::optional
            ((optional<slang::ast::ArgumentDirection> *)0x467b1d);
  slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)0x467b3e);
  cVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)0x467b5b);
  SVar12 = (SourceLocation)cVar9.list;
  code = cVar9.index._4_4_;
  while (bVar3 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>_>
                           ((self_type *)
                            CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50),
                            (iterator_base<const_slang::syntax::AssertionItemPortSyntax_*> *)
                            in_stack_fffffffffffffe48), ((bVar3 ^ 0xffU) & 1) != 0) {
    node = (SourceLocation)
           iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>,_false>
                        *)0x467b98);
    if (*(long *)((long)node + 0x10) != 0) {
      Scope::addMembers(in_stack_000004b0,in_stack_000004a8);
    }
    uVar10 = SUB84(pCVar5,0);
    uVar11 = (undefined4)((ulong)pCVar5 >> 0x20);
    local_88 = parsing::Token::valueText((Token *)in_stack_fffffffffffffe60);
    local_90 = parsing::Token::location((Token *)((long)node + 0x78));
    diag = BumpAllocator::
           emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     ((BumpAllocator *)in_stack_fffffffffffffe70,
                      (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe68,
                      (SourceLocation *)in_stack_fffffffffffffe60);
    Symbol::setSyntax(&diag->super_Symbol,(SyntaxNode *)node);
    this = diag;
    std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
    span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
              ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffe60,
               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffe58);
    syntax_00._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffe90;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffe88;
    syntax_00._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffe94;
    Symbol::setAttributes
              ((Symbol *)in_stack_fffffffffffffe80,(Scope *)in_stack_fffffffffffffe78,syntax_00);
    bVar3 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                       0x467cb0);
    if (!bVar3) {
      DeclaredType::setDimensionSyntax
                (&this->declaredType,
                 (SyntaxList<slang::syntax::VariableDimensionSyntax> *)((long)node + 0x88));
    }
    bVar3 = parsing::Token::operator_cast_to_bool((Token *)0x467ce5);
    if (bVar3) {
      bVar3 = parsing::Token::operator_cast_to_bool((Token *)0x467cfc);
      if (bVar3) {
        in_stack_fffffffffffffe94 = SemanticFacts::getDirection(*(TokenKind *)((long)node + 0x60));
      }
      else {
        in_stack_fffffffffffffe94 = In;
      }
      local_ac = in_stack_fffffffffffffe94;
      std::optional<slang::ast::ArgumentDirection>::optional<slang::ast::ArgumentDirection,_true>
                ((optional<slang::ast::ArgumentDirection> *)
                 CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50),
                 (ArgumentDirection *)in_stack_fffffffffffffe48);
      (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::ArgumentDirection> = local_a8;
      local_38 = (DataTypeSyntax *)0x0;
    }
    else {
      not_null<slang::syntax::DataTypeSyntax_*>::operator*
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x467d77);
      bVar3 = isEmptyType((DataTypeSyntax *)in_stack_fffffffffffffe58);
      if (bVar3) {
        (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload
        .super__Optional_payload_base<slang::ast::ArgumentDirection> = local_40;
      }
    }
    bVar3 = std::optional::operator_cast_to_bool
                      ((optional<slang::ast::ArgumentDirection> *)0x467db2);
    if (bVar3) {
      in_stack_fffffffffffffe88 = &this->declaredType;
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_b0,RequireSequenceType);
      DeclaredType::addFlags(in_stack_fffffffffffffe48,in_stack_fffffffffffffe54);
    }
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x467dfd);
    bVar3 = isEmptyType((DataTypeSyntax *)in_stack_fffffffffffffe58);
    if (bVar3) {
      if (local_38 == (DataTypeSyntax *)0x0) {
        DeclaredType::setType(&this->declaredType,newType);
        bVar3 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                          ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *
                           )0x467e68);
        if (!bVar3) {
          in_stack_fffffffffffffe80 = in_RDI;
          slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag);
          sourceRange.endLoc = SVar12;
          sourceRange.startLoc = node;
          Scope::addDiag((Scope *)this,code,sourceRange);
          ast::operator<<((Diagnostic *)diag,(Type *)CONCAT44(uVar11,uVar10));
        }
        bVar3 = parsing::Token::operator_cast_to_bool((Token *)0x467ef0);
        if ((bVar3) && (SVar1 != LetDecl)) {
          in_stack_fffffffffffffe78 = in_RDI;
          parsing::Token::range((Token *)in_stack_fffffffffffffe70);
          sourceRange_00.endLoc = SVar12;
          sourceRange_00.startLoc = node;
          Scope::addDiag((Scope *)this,code,sourceRange_00);
        }
      }
      else {
        DeclaredType::setTypeSyntax(&this->declaredType,local_38);
      }
    }
    else {
      in_stack_fffffffffffffe70 = &this->declaredType;
      pDVar7 = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                         ((not_null<slang::syntax::DataTypeSyntax_*> *)0x467f85);
      DeclaredType::setTypeSyntax(in_stack_fffffffffffffe70,pDVar7);
      local_38 = not_null::operator_cast_to_DataTypeSyntax_
                           ((not_null<slang::syntax::DataTypeSyntax_*> *)0x467fa3);
      pDVar7 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                         ((not_null<slang::syntax::DataTypeSyntax_*> *)0x467fbc);
      SVar2 = (pDVar7->super_ExpressionSyntax).super_SyntaxNode.kind;
      if ((SVar2 == PropertyType) && (SVar1 == Sequence)) {
        in_stack_fffffffffffffe68 = in_RDI;
        not_null<slang::syntax::DataTypeSyntax_*>::operator->
                  ((not_null<slang::syntax::DataTypeSyntax_*> *)0x468007);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag);
        sourceRange_01.endLoc = SVar12;
        sourceRange_01.startLoc = node;
        Scope::addDiag((Scope *)this,code,sourceRange_01);
      }
      else if (((SVar2 == PropertyType) || (SVar2 == SequenceType)) && (SVar1 == LetDecl)) {
        in_stack_fffffffffffffe58 = in_RDI;
        not_null<slang::syntax::DataTypeSyntax_*>::operator->
                  ((not_null<slang::syntax::DataTypeSyntax_*> *)0x46809c);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag);
        sourceRange_02.endLoc = SVar12;
        sourceRange_02.startLoc = node;
        in_stack_fffffffffffffe60 = Scope::addDiag((Scope *)this,code,sourceRange_02);
        not_null<slang::syntax::DataTypeSyntax_*>::operator->
                  ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4680eb);
        slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffe80);
        parsing::Token::valueText((Token *)in_stack_fffffffffffffe60);
        arg._M_len._4_4_ = uVar11;
        arg._M_len._0_4_ = uVar10;
        arg._M_str = (char *)diag;
        Diagnostic::operator<<
                  ((Diagnostic *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),arg);
      }
    }
    local_40 = (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
               _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>;
    if (*(long *)((long)node + 0xc0) != 0) {
      _Var4 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                              CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50),
                              (ArgumentDirection *)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe54.m_bits = CONCAT13(1,(int3)in_stack_fffffffffffffe54.m_bits);
      if (!_Var4) {
        _Var4 = std::operator==((optional<slang::ast::ArgumentDirection> *)
                                CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50)
                                ,(ArgumentDirection *)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe54.m_bits = CONCAT13(_Var4,(int3)in_stack_fffffffffffffe54.m_bits);
      }
      if ((char)(in_stack_fffffffffffffe54.m_bits >> 0x18) == '\0') {
        pPVar8 = not_null::operator_cast_to_PropertyExprSyntax_
                           ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x468245);
        this->defaultValueSyntax = pPVar8;
      }
      else {
        in_stack_fffffffffffffe48 = in_RDI;
        not_null<slang::syntax::PropertyExprSyntax_*>::operator->
                  ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x468202);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag);
        sourceRange_03.endLoc = SVar12;
        sourceRange_03.startLoc = node;
        Scope::addDiag((Scope *)this,code,sourceRange_03);
      }
    }
    Scope::addMember((Scope *)CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50),
                     (Symbol *)in_stack_fffffffffffffe48);
    SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *)
               CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50),
               (AssertionPortSymbol **)in_stack_fffffffffffffe48);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<const_slang::syntax::AssertionItemPortSyntax_*>,_false>
                *)CONCAT44(in_stack_fffffffffffffe54.m_bits,in_stack_fffffffffffffe50));
  }
  return;
}

Assistant:

void AssertionPortSymbol::buildPorts(Scope& scope, const AssertionItemPortListSyntax& syntax,
                                     SmallVectorBase<const AssertionPortSymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto parentKind = scope.asSymbol().kind;
    auto& untyped = comp.getType(SyntaxKind::Untyped);
    const DataTypeSyntax* lastType = nullptr;
    std::optional<ArgumentDirection> lastDir;

    for (auto item : syntax.ports) {
        if (item->previewNode)
            scope.addMembers(*item->previewNode);

        auto port = comp.emplace<AssertionPortSymbol>(item->name.valueText(),
                                                      item->name.location());
        port->setSyntax(*item);
        port->setAttributes(scope, item->attributes);

        if (!item->dimensions.empty())
            port->declaredType.setDimensionSyntax(item->dimensions);

        if (item->local) {
            port->direction = item->direction ? SemanticFacts::getDirection(item->direction.kind)
                                              : ArgumentDirection::In;

            // If we have a direction we can never inherit the previous type.
            lastType = nullptr;
        }
        else if (isEmptyType(*item->type)) {
            port->direction = lastDir;
        }

        // 'local' direction requires that we have a sequence type. This flag needs to be
        // added prior to setting a resolved type in the branches below.
        if (port->direction)
            port->declaredType.addFlags(DeclaredTypeFlags::RequireSequenceType);

        if (isEmptyType(*item->type)) {
            if (lastType)
                port->declaredType.setTypeSyntax(*lastType);
            else {
                port->declaredType.setType(untyped);
                if (!item->dimensions.empty()) {
                    scope.addDiag(diag::InvalidArrayElemType, item->dimensions.sourceRange())
                        << untyped;
                }

                if (item->local && parentKind != SymbolKind::LetDecl)
                    scope.addDiag(diag::LocalVarTypeRequired, item->local.range());
            }
        }
        else {
            port->declaredType.setTypeSyntax(*item->type);
            lastType = item->type;

            // Ports of type 'property' are not allowed in sequences,
            // and let declarations cannot have ports of type 'sequence' or 'property'.
            auto itemKind = item->type->kind;
            if (itemKind == SyntaxKind::PropertyType && parentKind == SymbolKind::Sequence) {
                scope.addDiag(diag::PropertyPortInSeq, item->type->sourceRange());
            }
            else if ((itemKind == SyntaxKind::PropertyType ||
                      itemKind == SyntaxKind::SequenceType) &&
                     parentKind == SymbolKind::LetDecl) {
                scope.addDiag(diag::PropertyPortInLet, item->type->sourceRange())
                    << item->type->getFirstToken().valueText();
            }
        }

        lastDir = port->direction;
        if (item->defaultValue) {
            if (port->direction == ArgumentDirection::Out ||
                port->direction == ArgumentDirection::InOut) {
                scope.addDiag(diag::AssertionPortOutputDefault,
                              item->defaultValue->expr->sourceRange());
            }
            else {
                port->defaultValueSyntax = item->defaultValue->expr;
            }
        }

        scope.addMember(*port);
        results.push_back(port);
    }
}